

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int NV21ToNV12(uint8_t *src_y,int src_stride_y,uint8_t *src_vu,int src_stride_vu,uint8_t *dst_y,
              int dst_stride_y,uint8_t *dst_uv,int dst_stride_uv,int width,int height)

{
  int width_00;
  int height_00;
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  int in_R9D;
  long in_stack_00000008;
  int halfheight;
  int halfwidth;
  int in_stack_00000020;
  int in_stack_ffffffffffffffd8;
  int local_4;
  
  width_00 = (int)dst_y + 1 >> 1;
  height_00 = in_stack_00000020 + 1 >> 1;
  if ((((in_RDX == (uint8_t *)0x0) || (in_stack_00000008 == 0)) || ((int)dst_y < 1)) ||
     (in_stack_00000020 == 0)) {
    local_4 = -1;
  }
  else {
    if (in_R8 != (uint8_t *)0x0) {
      CopyPlane(in_RDI,in_ESI,in_RDX,in_ECX,in_stack_ffffffffffffffd8,(int)((ulong)in_R8 >> 0x20));
    }
    if (in_stack_00000020 < 0) {
      in_stack_00000020 = -in_stack_00000020;
      height_00 = in_stack_00000020 + 1 >> 1;
      in_RDX = in_RDX + (height_00 + -1) * in_ECX;
      in_ECX = -in_ECX;
    }
    SwapUVPlane(in_RDX,in_ECX,in_R8,in_R9D,width_00,height_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int NV21ToNV12(const uint8_t* src_y,
               int src_stride_y,
               const uint8_t* src_vu,
               int src_stride_vu,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_uv,
               int dst_stride_uv,
               int width,
               int height) {
  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  if (!src_vu || !dst_uv || width <= 0 || height == 0) {
    return -1;
  }
  if (dst_y) {
    CopyPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  }

  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    halfheight = (height + 1) >> 1;
    src_vu = src_vu + (halfheight - 1) * src_stride_vu;
    src_stride_vu = -src_stride_vu;
  }

  SwapUVPlane(src_vu, src_stride_vu, dst_uv, dst_stride_uv, halfwidth,
              halfheight);
  return 0;
}